

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

int check_stored_host_key(char *hostname,int port,char *keytype,char *key)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  size_t sVar3;
  char *pcVar4;
  char local_78 [8];
  char porttext [20];
  char *p;
  int i;
  int ret;
  char *line;
  char *filename;
  FILE *fp;
  char *key_local;
  char *keytype_local;
  int port_local;
  char *hostname_local;
  
  pcVar2 = make_filename(1,(char *)0x0);
  __stream = fopen(pcVar2,"r");
  safefree(pcVar2);
  if (__stream == (FILE *)0x0) {
    hostname_local._4_4_ = 1;
  }
  else {
    p._4_4_ = 1;
    do {
      pcVar2 = fgetline((FILE *)__stream);
      if (pcVar2 == (char *)0x0) break;
      sVar3 = strcspn(pcVar2,"\n");
      pcVar2[sVar3] = '\0';
      sVar3 = strlen(keytype);
      iVar1 = strncmp(pcVar2,keytype,(long)(int)sVar3);
      if ((iVar1 == 0) && (pcVar4 = pcVar2 + (int)sVar3, *pcVar4 == '@')) {
        pcVar4 = pcVar4 + 1;
        sprintf(local_78,"%d",(ulong)(uint)port);
        sVar3 = strlen(local_78);
        iVar1 = strncmp(pcVar4,local_78,(long)(int)sVar3);
        if ((iVar1 == 0) && (pcVar4 = pcVar4 + (int)sVar3, *pcVar4 == ':')) {
          pcVar4 = pcVar4 + 1;
          sVar3 = strlen(hostname);
          iVar1 = strncmp(pcVar4,hostname,(long)(int)sVar3);
          if ((iVar1 == 0) && (pcVar4[(int)sVar3] == ' ')) {
            iVar1 = strcmp(pcVar4 + (int)sVar3 + 1,key);
            if (iVar1 == 0) {
              p._4_4_ = 0;
            }
            else {
              p._4_4_ = 2;
            }
          }
        }
      }
      safefree(pcVar2);
    } while (p._4_4_ == 1);
    fclose(__stream);
    hostname_local._4_4_ = p._4_4_;
  }
  return hostname_local._4_4_;
}

Assistant:

int check_stored_host_key(const char *hostname, int port,
                          const char *keytype, const char *key)
{
    FILE *fp;
    char *filename;
    char *line;
    int ret;

    filename = make_filename(INDEX_HOSTKEYS, NULL);
    fp = fopen(filename, "r");
    sfree(filename);
    if (!fp)
        return 1;                      /* key does not exist */

    ret = 1;
    while ( (line = fgetline(fp)) ) {
        int i;
        char *p = line;
        char porttext[20];

        line[strcspn(line, "\n")] = '\0';   /* strip trailing newline */

        i = strlen(keytype);
        if (strncmp(p, keytype, i))
            goto done;
        p += i;

        if (*p != '@')
            goto done;
        p++;

        sprintf(porttext, "%d", port);
        i = strlen(porttext);
        if (strncmp(p, porttext, i))
            goto done;
        p += i;

        if (*p != ':')
            goto done;
        p++;

        i = strlen(hostname);
        if (strncmp(p, hostname, i))
            goto done;
        p += i;

        if (*p != ' ')
            goto done;
        p++;

        /*
         * Found the key. Now just work out whether it's the right
         * one or not.
         */
        if (!strcmp(p, key))
            ret = 0;                   /* key matched OK */
        else
            ret = 2;                   /* key mismatch */

        done:
        sfree(line);
        if (ret != 1)
            break;
    }

    fclose(fp);
    return ret;
}